

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_quads_to_grids
          (SceneGraph *this,Ref<embree::SceneGraph::QuadMeshNode> *qmesh,uint resX,uint resY)

{
  pointer *ppGVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  QuadMeshNode *pQVar4;
  pointer pQVar5;
  pointer pvVar6;
  ulong uVar7;
  Vec3fa *pVVar8;
  iterator __position;
  ulong uVar9;
  long lVar10;
  GridMeshNode *this_00;
  Vec3fa *pVVar11;
  long lVar12;
  ulong uVar13;
  undefined4 in_register_00000014;
  size_t sVar14;
  ulong uVar15;
  undefined8 uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  uint local_124;
  Grid local_114;
  ulong local_108;
  Ref<embree::SceneGraph::QuadMeshNode> *local_100;
  long local_f8;
  Ref<embree::SceneGraph::MaterialNode> local_f0;
  uint local_e4;
  float local_e0;
  float local_dc;
  Node *local_d8;
  pointer local_d0;
  pointer local_c8;
  QuadMeshNode *local_c0;
  undefined8 local_b8;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *local_b0;
  long local_a8;
  long local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_b8 = CONCAT44(in_register_00000014,resX);
  pQVar4 = qmesh->ptr;
  local_c8 = (pQVar4->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (pQVar4->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_100 = qmesh;
  local_d8 = (Node *)this;
  this_00 = (GridMeshNode *)operator_new(0xa8);
  local_f0.ptr = (pQVar4->material).ptr;
  if (local_f0.ptr != (MaterialNode *)0x0) {
    (*((local_f0.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  sVar14 = (long)local_d0 - (long)local_c8 >> 5;
  GridMeshNode::GridMeshNode(this_00,&local_f0,local_100->ptr->time_range,sVar14);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_f0.ptr != (MaterialNode *)0x0) {
    (*((local_f0.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_c0 = local_100->ptr;
  if ((local_c0->quads).
      super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_c0->quads).
      super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_dc = (float)((int)local_b8 - 1);
    local_e0 = (float)(resY - 1);
    local_b0 = &this_00->grids;
    local_a0 = sVar14 + (sVar14 == 0);
    local_108 = 0;
    uVar16 = local_b8;
    do {
      local_e4 = (uint)((this_00->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->size_active;
      if (local_d0 != local_c8) {
        local_a8 = local_108 << 4;
        local_f8 = 0;
        do {
          lVar10 = local_f8;
          if (resY != 0) {
            pQVar5 = (local_c0->quads).
                     super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pVVar11 = (local_100->ptr->positions).
                      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_f8].items;
            pVVar8 = pVVar11 + *(uint *)((long)&pQVar5->v0 + local_a8);
            fVar20 = (pVVar8->field_0).m128[0];
            fVar21 = (pVVar8->field_0).m128[1];
            fVar22 = (pVVar8->field_0).m128[2];
            fVar23 = (pVVar8->field_0).m128[3];
            pVVar8 = pVVar11 + *(uint *)((long)&pQVar5->v1 + local_a8);
            fVar24 = (pVVar8->field_0).m128[0];
            fVar25 = (pVVar8->field_0).m128[1];
            fVar26 = (pVVar8->field_0).m128[2];
            fVar27 = (pVVar8->field_0).m128[3];
            pVVar8 = pVVar11 + *(uint *)((long)&pQVar5->v3 + local_a8);
            fVar28 = (pVVar8->field_0).m128[0];
            fVar29 = (pVVar8->field_0).m128[1];
            fVar30 = (pVVar8->field_0).m128[2];
            fVar31 = (pVVar8->field_0).m128[3];
            pVVar11 = pVVar11 + *(uint *)((long)&pQVar5->v2 + local_a8);
            fVar32 = (pVVar11->field_0).m128[0];
            fVar33 = (pVVar11->field_0).m128[1];
            fVar34 = (pVVar11->field_0).m128[2];
            fVar35 = (pVVar11->field_0).m128[3];
            local_124 = 0;
            local_98 = fVar32;
            fStack_94 = fVar33;
            fStack_90 = fVar34;
            fStack_8c = fVar35;
            local_88 = fVar28;
            fStack_84 = fVar29;
            fStack_80 = fVar30;
            fStack_7c = fVar31;
            local_78 = fVar24;
            fStack_74 = fVar25;
            fStack_70 = fVar26;
            fStack_6c = fVar27;
            local_68 = fVar20;
            fStack_64 = fVar21;
            fStack_60 = fVar22;
            fStack_5c = fVar23;
            do {
              if ((int)uVar16 != 0) {
                fVar36 = (float)local_124 / local_e0;
                fVar40 = 1.0 - fVar36;
                uVar17 = 0;
                fVar37 = fVar36;
                fVar38 = fVar36;
                fVar39 = fVar36;
                fVar41 = fVar40;
                fVar42 = fVar40;
                fVar43 = fVar40;
                local_58 = fVar40;
                fStack_54 = fVar40;
                fStack_50 = fVar40;
                fStack_4c = fVar40;
                local_48 = fVar36;
                fStack_44 = fVar36;
                fStack_40 = fVar36;
                fStack_3c = fVar36;
                do {
                  pvVar6 = (this_00->positions).
                           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  sVar14 = pvVar6[lVar10].size_active;
                  uVar7 = pvVar6[lVar10].size_alloced;
                  uVar13 = sVar14 + 1;
                  uVar15 = uVar7;
                  if ((uVar7 < uVar13) && (uVar15 = uVar13, uVar9 = uVar7, uVar7 != 0)) {
                    for (; uVar15 = uVar9, uVar9 < uVar13;
                        uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
                    }
                  }
                  if (uVar7 != uVar15) {
                    pVVar8 = pvVar6[lVar10].items;
                    pVVar11 = (Vec3fa *)alignedMalloc(uVar15 << 4,0x10);
                    pvVar6[lVar10].items = pVVar11;
                    if (pvVar6[lVar10].size_active != 0) {
                      lVar12 = 0;
                      uVar13 = 0;
                      do {
                        puVar2 = (undefined8 *)((long)&pVVar8->field_0 + lVar12);
                        uVar16 = puVar2[1];
                        puVar3 = (undefined8 *)((long)&(pvVar6[lVar10].items)->field_0 + lVar12);
                        *puVar3 = *puVar2;
                        puVar3[1] = uVar16;
                        uVar13 = uVar13 + 1;
                        lVar12 = lVar12 + 0x10;
                      } while (uVar13 < pvVar6[lVar10].size_active);
                    }
                    alignedFree(pVVar8);
                    pvVar6[lVar10].size_active = sVar14;
                    pvVar6[lVar10].size_alloced = uVar15;
                    uVar16 = local_b8;
                    fVar20 = local_68;
                    fVar21 = fStack_64;
                    fVar22 = fStack_60;
                    fVar23 = fStack_5c;
                    fVar24 = local_78;
                    fVar25 = fStack_74;
                    fVar26 = fStack_70;
                    fVar27 = fStack_6c;
                    fVar28 = local_88;
                    fVar29 = fStack_84;
                    fVar30 = fStack_80;
                    fVar31 = fStack_7c;
                    fVar32 = local_98;
                    fVar33 = fStack_94;
                    fVar34 = fStack_90;
                    fVar35 = fStack_8c;
                    fVar36 = local_48;
                    fVar37 = fStack_44;
                    fVar38 = fStack_40;
                    fVar39 = fStack_3c;
                    fVar40 = local_58;
                    fVar41 = fStack_54;
                    fVar42 = fStack_50;
                    fVar43 = fStack_4c;
                  }
                  fVar18 = (float)uVar17 / local_dc;
                  fVar19 = 1.0 - fVar18;
                  sVar14 = pvVar6[lVar10].size_active;
                  pvVar6[lVar10].size_active = sVar14 + 1;
                  pVVar8 = pvVar6[lVar10].items + sVar14;
                  (pVVar8->field_0).m128[0] =
                       fVar18 * fVar32 * fVar36 +
                       fVar19 * fVar28 * fVar36 +
                       fVar24 * fVar18 * fVar40 + fVar20 * fVar19 * fVar40;
                  (pVVar8->field_0).m128[1] =
                       fVar18 * fVar33 * fVar37 +
                       fVar19 * fVar29 * fVar37 +
                       fVar25 * fVar18 * fVar41 + fVar21 * fVar19 * fVar41;
                  (pVVar8->field_0).m128[2] =
                       fVar18 * fVar34 * fVar38 +
                       fVar19 * fVar30 * fVar38 +
                       fVar26 * fVar18 * fVar42 + fVar22 * fVar19 * fVar42;
                  (pVVar8->field_0).m128[3] =
                       fVar18 * fVar35 * fVar39 +
                       fVar19 * fVar31 * fVar39 +
                       fVar27 * fVar18 * fVar43 + fVar23 * fVar19 * fVar43;
                  uVar17 = uVar17 + 1;
                } while (uVar17 != (uint)uVar16);
              }
              local_124 = local_124 + 1;
            } while (local_124 != resY);
          }
          local_f8 = local_f8 + 1;
        } while (local_f8 != local_a0);
      }
      local_114.startVtx = local_e4;
      local_114.lineStride = (uint)uVar16;
      local_114.resY = (unsigned_short)resY;
      local_114.resX = (unsigned_short)uVar16;
      __position._M_current =
           (this_00->grids).
           super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->grids).
          super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
        ::_M_realloc_insert<embree::SceneGraph::GridMeshNode::Grid>(local_b0,__position,&local_114);
      }
      else {
        (__position._M_current)->resX = (unsigned_short)uVar16;
        (__position._M_current)->resY = (unsigned_short)resY;
        (__position._M_current)->startVtx = local_e4;
        (__position._M_current)->lineStride = local_114.lineStride;
        ppGVar1 = &(this_00->grids).
                   super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      local_108 = local_108 + 1;
    } while (local_108 <
             (ulong)((long)(local_c0->quads).
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_c0->quads).
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  (local_d8->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_d8;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_grids ( Ref<SceneGraph::QuadMeshNode> qmesh , const unsigned int resX, const unsigned int resY )
  {
    const size_t timeSteps = qmesh->positions.size();
    Ref<SceneGraph::GridMeshNode> gmesh = new SceneGraph::GridMeshNode(qmesh->material,qmesh->time_range,timeSteps);
    std::vector<SceneGraph::QuadMeshNode::Quad>& quads = qmesh->quads;

    for (size_t i=0;i<quads.size();i++)
    {
      const unsigned int startVtx = (unsigned int) gmesh->positions[0].size();
      const unsigned int lineStride = resX;
      for (size_t t=0;t<timeSteps;t++)
      {
        const SceneGraph::GridMeshNode::Vertex v00 = qmesh->positions[t][quads[i].v0];
        const SceneGraph::GridMeshNode::Vertex v01 = qmesh->positions[t][quads[i].v1];
        const SceneGraph::GridMeshNode::Vertex v10 = qmesh->positions[t][quads[i].v3];
        const SceneGraph::GridMeshNode::Vertex v11 = qmesh->positions[t][quads[i].v2];
        for (unsigned int y=0; y<resY; y++)
        {
          for (unsigned int x=0; x<resX; x++)
          {
            const float u = (float)x / (resX-1);
            const float v = (float)y / (resY-1);
            const SceneGraph::GridMeshNode::Vertex vtx = v00 * (1.0f-u) * (1.0f-v) + v01 * u * (1.0f-v) + v10 * (1.0f-u) * v + v11 * u * v;
            gmesh->positions[t].push_back( vtx );
          }
        }
      }
      assert(startVtx + resX * resY == gmesh->positions[0].size());
      gmesh->grids.push_back(SceneGraph::GridMeshNode::Grid(startVtx,lineStride,resX,resY));
    }
    return gmesh.dynamicCast<SceneGraph::Node>();
  }